

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricKey.cpp
# Opt level: O0

ByteString * __thiscall SymmetricKey::getKeyCheckValue(SymmetricKey *this)

{
  byte bVar1;
  int iVar2;
  CryptoFactory *pCVar3;
  undefined4 extraout_var;
  ByteString *this_00;
  long in_RSI;
  ByteString *in_RDI;
  HashAlgorithm *hash;
  ByteString *digest;
  size_t in_stack_ffffffffffffff88;
  long *plVar4;
  
  ByteString::ByteString((ByteString *)0x1a9fef);
  pCVar3 = CryptoFactory::i();
  iVar2 = (*pCVar3->_vptr_CryptoFactory[4])(pCVar3,2);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar4 != (long *)0x0) {
    bVar1 = (**(code **)(*plVar4 + 0x10))();
    if ((((bVar1 & 1) == 0) ||
        (bVar1 = (**(code **)(*plVar4 + 0x18))(plVar4,in_RSI + 8), (bVar1 & 1) == 0)) ||
       (bVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,in_RDI), (bVar1 & 1) == 0)) {
      pCVar3 = CryptoFactory::i();
      (*pCVar3->_vptr_CryptoFactory[5])(pCVar3,plVar4);
    }
    else {
      this_00 = (ByteString *)CryptoFactory::i();
      (*this_00->_vptr_ByteString[5])(this_00,plVar4);
      ByteString::resize(this_00,in_stack_ffffffffffffff88);
    }
  }
  return in_RDI;
}

Assistant:

ByteString SymmetricKey::getKeyCheckValue() const
{
	ByteString digest;

	HashAlgorithm* hash = CryptoFactory::i()->getHashAlgorithm(HashAlgo::SHA1);
	if (hash == NULL) return digest;

	if (!hash->hashInit() ||
	    !hash->hashUpdate(keyData) ||
	    !hash->hashFinal(digest))
	{
		CryptoFactory::i()->recycleHashAlgorithm(hash);
		return digest;
	}
	CryptoFactory::i()->recycleHashAlgorithm(hash);

	digest.resize(3);

	return digest;
}